

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,double value,bool outOfRange,optional<slang::TimeUnit> timeUnit)

{
  byte bVar1;
  
  (this->numFlags).raw = '\0';
  this->rawLen = 0;
  this->info = (Info *)0x0;
  if ((kind & ~EndOfFile) == RealLiteral) {
    init(this,(EVP_PKEY_CTX *)alloc);
    this->info[1].rawTextPtr = (char *)value;
    bVar1 = timeUnit.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeUnit>._M_payload * '\b';
    if (((ushort)timeUnit.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeUnit> >> 8 & 1) == 0) {
      bVar1 = 0;
    }
    (this->numFlags).raw = bVar1 | outOfRange << 6 | (this->numFlags).raw;
    return;
  }
  assert::assertFailed
            ("kind == TokenKind::RealLiteral || kind == TokenKind::TimeLiteral",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
             ,0xea,
             "slang::parsing::Token::Token(BumpAllocator &, TokenKind, span<const Trivia>, string_view, SourceLocation, double, bool, std::optional<TimeUnit>)"
            );
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, span<Trivia const> trivia, string_view rawText,
             SourceLocation location, double value, bool outOfRange,
             std::optional<TimeUnit> timeUnit) {
    ASSERT(kind == TokenKind::RealLiteral || kind == TokenKind::TimeLiteral);
    init(alloc, kind, trivia, rawText, location);
    info->real() = value;

    numFlags.setOutOfRange(outOfRange);
    if (timeUnit)
        numFlags.set(*timeUnit);
}